

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Mem * out2PrereleaseWithClear(Mem *pOut)

{
  Mem *in_RDI;
  
  sqlite3VdbeMemSetNull((Mem *)0x18d95e);
  in_RDI->flags = 4;
  return in_RDI;
}

Assistant:

static SQLITE_NOINLINE Mem *out2PrereleaseWithClear(Mem *pOut){
  sqlite3VdbeMemSetNull(pOut);
  pOut->flags = MEM_Int;
  return pOut;
}